

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_read_format_zip.c
# Opt level: O0

void test_write_read_format_zip_improved_streaming(void)

{
  archive *a_00;
  archive *paVar1;
  archive *a_01;
  archive *paVar2;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  int in_stack_00000038;
  int in_stack_0000003c;
  archive *in_stack_00000040;
  void *in_stack_ffffffffffffffd8;
  archive *_a;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  
  _a = (archive *)0xf4240;
  a_00 = (archive *)malloc(1000000);
  paVar1 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)a_00,in_stack_ffffffffffffffd8);
  archive_write_set_format_zip(_a);
  assertion_equal_int((char *)paVar1,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar1,(char *)0x224eb8,(void *)buffsize);
  archive_write_add_filter_none(paVar1);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar1,(char *)0x224ef1,(void *)buffsize);
  archive_write_set_options(a_00,(char *)paVar1);
  assertion_equal_int((char *)paVar2,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar2,(char *)0x224f31,(void *)buffsize);
  archive_write_open_memory
            (paVar2,(void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(size_t)_a
             ,(size_t *)a_00);
  assertion_equal_int((char *)paVar2,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar2,(char *)0x224f79,(void *)buffsize);
  write_contents((archive *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  dumpfile((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),_a,(size_t)a_00);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)a_00,paVar2);
  archive_read_support_format_all(paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar1,(char *)0x225005,(void *)buffsize);
  archive_read_support_filter_all(paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar2,(char *)0x22503e,(void *)buffsize);
  archive_read_open_memory(a_00,paVar2,0x225052);
  assertion_equal_int((char *)paVar1,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar1,(char *)0x225081,(void *)buffsize);
  verify_contents(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  a_01 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)a_00,paVar1);
  archive_read_support_format_all(paVar1);
  paVar2 = a_01;
  assertion_equal_int((char *)a_01,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)a_01,(char *)0x2250fe,(void *)buffsize);
  archive_read_support_filter_all(a_01);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar2,(char *)0x225137,(void *)buffsize);
  read_open_memory((archive *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),_a,
                   (size_t)a_00,(size_t)paVar2);
  assertion_equal_int((char *)paVar1,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar1,(char *)0x22517f,(void *)buffsize);
  verify_contents(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  paVar2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)a_00,paVar1);
  archive_read_support_format_all(paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar2,(char *)0x2251fc,(void *)buffsize);
  archive_read_support_filter_all(paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar1,(char *)0x225235,(void *)buffsize);
  read_open_memory_seek
            ((archive *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),_a,
             (size_t)a_00,(size_t)paVar1);
  assertion_equal_int((char *)paVar2,in_stack_fffffffffffffff4,(longlong)_a,(char *)a_00,
                      (longlong)paVar2,(char *)0x22527d,(void *)buffsize);
  verify_contents(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
  free(a_00);
  return;
}

Assistant:

DEFINE_TEST(test_write_read_format_zip_improved_streaming)
{
	struct archive *a;
	size_t used;
	size_t buffsize = 1000000;
	char *buff;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));
	write_contents(a);
	dumpfile("constructed.zip", buff, used);

	/*
	 * Now, read the data back.
	 */
	/* With the standard memory reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));
	verify_contents(a, 1, 1);

	/* With the test memory reader -- streaming mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 7));
	/* Streaming reader doesn't see mode information from Central Directory. */
	verify_contents(a, 0, 1);

	/* With the test memory reader -- seeking mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));
	verify_contents(a, 1, 1);

	free(buff);
}